

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_perftest.cc
# Opt level: O0

int LoadManifests(bool measure_command_evaluation)

{
  FILE *__stream;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  size_type sVar5;
  reference ppEVar6;
  string local_208;
  ulong local_1e8;
  size_t i;
  int optimization_guard;
  ManifestParserOptions local_1b8;
  undefined1 local_1b0 [8];
  ManifestParser parser;
  State state;
  FileReader local_38;
  RealDiskInterface disk_interface;
  string err;
  bool measure_command_evaluation_local;
  
  std::__cxx11::string::string((string *)&disk_interface);
  RealDiskInterface::RealDiskInterface((RealDiskInterface *)&local_38);
  State::State((State *)&parser.quiet_);
  ManifestParserOptions::ManifestParserOptions(&local_1b8);
  ManifestParser::ManifestParser
            ((ManifestParser *)local_1b0,(State *)&parser.quiet_,&local_38,local_1b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&optimization_guard,"build.ninja",(allocator<char> *)((long)&i + 7));
  bVar2 = Parser::Load((Parser *)local_1b0,(string *)&optimization_guard,(string *)&disk_interface,
                       (Lexer *)0x0);
  std::__cxx11::string::~string((string *)&optimization_guard);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  __stream = _stderr;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    uVar4 = std::__cxx11::string::c_str();
    fprintf(__stream,"Failed to read test data: %s\n",uVar4);
    exit(1);
  }
  i._0_4_ = 0;
  if (measure_command_evaluation) {
    for (local_1e8 = 0; uVar1 = local_1e8,
        sVar5 = std::vector<Edge_*,_std::allocator<Edge_*>_>::size
                          ((vector<Edge_*,_std::allocator<Edge_*>_> *)
                           &state.pools_._M_t._M_impl.super__Rb_tree_header._M_node_count),
        uVar1 < sVar5; local_1e8 = local_1e8 + 1) {
      ppEVar6 = std::vector<Edge_*,_std::allocator<Edge_*>_>::operator[]
                          ((vector<Edge_*,_std::allocator<Edge_*>_> *)
                           &state.pools_._M_t._M_impl.super__Rb_tree_header._M_node_count,local_1e8)
      ;
      Edge::EvaluateCommand_abi_cxx11_(&local_208,*ppEVar6,false);
      iVar3 = std::__cxx11::string::size();
      i._0_4_ = (int)i + iVar3;
      std::__cxx11::string::~string((string *)&local_208);
    }
  }
  iVar3 = (int)i;
  State::~State((State *)&parser.quiet_);
  RealDiskInterface::~RealDiskInterface((RealDiskInterface *)&local_38);
  std::__cxx11::string::~string((string *)&disk_interface);
  return iVar3;
}

Assistant:

int LoadManifests(bool measure_command_evaluation) {
  string err;
  RealDiskInterface disk_interface;
  State state;
  ManifestParser parser(&state, &disk_interface);
  if (!parser.Load("build.ninja", &err)) {
    fprintf(stderr, "Failed to read test data: %s\n", err.c_str());
    exit(1);
  }
  // Doing an empty build involves reading the manifest and evaluating all
  // commands required for the requested targets. So include command
  // evaluation in the perftest by default.
  int optimization_guard = 0;
  if (measure_command_evaluation)
    for (size_t i = 0; i < state.edges_.size(); ++i)
      optimization_guard += state.edges_[i]->EvaluateCommand().size();
  return optimization_guard;
}